

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

int __thiscall FNodeBuilder::FVertexMap::InsertVertex(FVertexMap *this,FPrivVert *vert)

{
  int iVar1;
  int iVar2;
  int y;
  int y_00;
  uint uVar3;
  int local_5c;
  uint local_58;
  int i;
  uint blkcount [4];
  int blk [4];
  fixed_t maxy;
  fixed_t miny;
  fixed_t maxx;
  fixed_t minx;
  int vertnum;
  FPrivVert *vert_local;
  FVertexMap *this_local;
  
  vert->segs = 0xffffffff;
  vert->segs2 = 0xffffffff;
  _minx = vert;
  vert_local = (FPrivVert *)this;
  maxx = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Push
                   (&this->MyBuilder->Vertices,vert);
  iVar1 = MAX<int>(this->MinX,(_minx->super_FSimpleVert).x + -6);
  iVar2 = MIN<int>(this->MaxX,(_minx->super_FSimpleVert).x + 6);
  y = MAX<int>(this->MinY,(_minx->super_FSimpleVert).y + -6);
  y_00 = MIN<int>(this->MaxY,(_minx->super_FSimpleVert).y + 6);
  blkcount[2] = GetBlock(this,iVar1,y);
  blkcount[3] = GetBlock(this,iVar2,y);
  iVar1 = GetBlock(this,iVar1,y_00);
  iVar2 = GetBlock(this,iVar2,y_00);
  local_58 = TArray<int,_int>::Size(this->VertexGrid + (int)blkcount[2]);
  i = TArray<int,_int>::Size(this->VertexGrid + (int)blkcount[3]);
  blkcount[0] = TArray<int,_int>::Size(this->VertexGrid + iVar1);
  blkcount[1] = TArray<int,_int>::Size(this->VertexGrid + iVar2);
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    uVar3 = TArray<int,_int>::Size(this->VertexGrid + (int)blkcount[(long)local_5c + 2]);
    if (uVar3 == (&local_58)[local_5c]) {
      TArray<int,_int>::Push(this->VertexGrid + (int)blkcount[(long)local_5c + 2],&maxx);
    }
  }
  return maxx;
}

Assistant:

int FNodeBuilder::FVertexMap::InsertVertex (FNodeBuilder::FPrivVert &vert)
{
	int vertnum;

	vert.segs = DWORD_MAX;
	vert.segs2 = DWORD_MAX;
	vertnum = (int)MyBuilder.Vertices.Push (vert);

	// If a vertex is near a block boundary, then it will be inserted on
	// both sides of the boundary so that SelectVertexClose can find
	// it by checking in only one block.
	fixed_t minx = MAX (MinX, vert.x - VERTEX_EPSILON);
	fixed_t maxx = MIN (MaxX, vert.x + VERTEX_EPSILON);
	fixed_t miny = MAX (MinY, vert.y - VERTEX_EPSILON);
	fixed_t maxy = MIN (MaxY, vert.y + VERTEX_EPSILON);

	int blk[4] =
	{
		GetBlock (minx, miny),
		GetBlock (maxx, miny),
		GetBlock (minx, maxy),
		GetBlock (maxx, maxy)
	};
	unsigned int blkcount[4] =
	{
		VertexGrid[blk[0]].Size(),
		VertexGrid[blk[1]].Size(),
		VertexGrid[blk[2]].Size(),
		VertexGrid[blk[3]].Size()
	};
	for (int i = 0; i < 4; ++i)
	{
		if (VertexGrid[blk[i]].Size() == blkcount[i])
		{
			VertexGrid[blk[i]].Push (vertnum);
		}
	}

	return vertnum;
}